

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpHeaders::Request> * __thiscall
kj::HttpHeaders::tryParseRequest
          (Maybe<kj::HttpHeaders::Request> *__return_storage_ptr__,HttpHeaders *this,
          ArrayPtr<char> content)

{
  bool bVar1;
  char *end_00;
  NullableValue<kj::HttpMethod> *other;
  HttpMethod *pHVar2;
  NullableValue<kj::StringPtr> *other_00;
  StringPtr *pSVar3;
  StringPtr *pSVar4;
  ArrayPtr<char> content_00;
  Maybe<kj::StringPtr> local_b0;
  undefined1 local_98 [8];
  NullableValue<kj::StringPtr> path;
  Maybe<kj::HttpMethod> local_70;
  NullableValue<kj::HttpMethod> local_68;
  NullableValue<kj::HttpMethod> method;
  Request request;
  char *ptr;
  char *end;
  HttpHeaders *this_local;
  ArrayPtr<char> content_local;
  
  content_local.ptr = (char *)content.size_;
  content_00.size_ = (HttpHeaders *)content.ptr;
  content_00.ptr = content_local.ptr;
  this_local = content_00.size_;
  content_local.size_ = (size_t)__return_storage_ptr__;
  end_00 = trimHeaderEnding((kj *)content_00.size_,content_00);
  if (end_00 == (char *)0x0) {
    Maybe<kj::HttpHeaders::Request>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    request.url.content.size_ = (size_t)ArrayPtr<char>::begin((ArrayPtr<char> *)&this_local);
    Request::Request((Request *)&method);
    consumeHttpMethod((kj *)&local_70,(char **)&request.url.content.size_);
    other = _::readMaybe<kj::HttpMethod>(&local_70);
    _::NullableValue<kj::HttpMethod>::NullableValue(&local_68,other);
    Maybe<kj::HttpMethod>::~Maybe(&local_70);
    pHVar2 = _::NullableValue::operator_cast_to_HttpMethod_((NullableValue *)&local_68);
    if (pHVar2 == (HttpMethod *)0x0) {
      Maybe<kj::HttpHeaders::Request>::Maybe(__return_storage_ptr__,(void *)0x0);
      path.field_1.value.content.size_._0_4_ = 1;
    }
    else {
      pHVar2 = _::NullableValue<kj::HttpMethod>::operator*(&local_68);
      method._0_4_ = *pHVar2;
      if ((*(char *)request.url.content.size_ == ' ') ||
         (*(char *)request.url.content.size_ == '\t')) {
        request.url.content.size_ = request.url.content.size_ + 1;
        path.field_1.value.content.size_._0_4_ = 0;
      }
      else {
        Maybe<kj::HttpHeaders::Request>::Maybe(__return_storage_ptr__,(void *)0x0);
        path.field_1.value.content.size_._0_4_ = 1;
      }
    }
    _::NullableValue<kj::HttpMethod>::~NullableValue(&local_68);
    if (path.field_1.value.content.size_._0_4_ == 0) {
      consumeWord(&local_b0,(char **)&request.url.content.size_);
      other_00 = _::readMaybe<kj::StringPtr>(&local_b0);
      _::NullableValue<kj::StringPtr>::NullableValue
                ((NullableValue<kj::StringPtr> *)local_98,other_00);
      Maybe<kj::StringPtr>::~Maybe(&local_b0);
      pSVar3 = _::NullableValue::operator_cast_to_StringPtr_((NullableValue *)local_98);
      if (pSVar3 == (StringPtr *)0x0) {
        Maybe<kj::HttpHeaders::Request>::Maybe(__return_storage_ptr__,(void *)0x0);
      }
      else {
        pSVar4 = _::NullableValue<kj::StringPtr>::operator*
                           ((NullableValue<kj::StringPtr> *)local_98);
        request._0_8_ = (pSVar4->content).ptr;
        request.url.content.ptr = (char *)(pSVar4->content).size_;
      }
      path.field_1.value.content.size_._1_3_ = 0;
      path.field_1.value.content.size_._0_1_ = pSVar3 == (StringPtr *)0x0;
      _::NullableValue<kj::StringPtr>::~NullableValue((NullableValue<kj::StringPtr> *)local_98);
      if (path.field_1.value.content.size_._0_4_ == 0) {
        consumeLine((char **)&request.url.content.size_);
        bVar1 = parseHeaders(this,(char *)request.url.content.size_,end_00);
        if (bVar1) {
          Maybe<kj::HttpHeaders::Request>::Maybe(__return_storage_ptr__,(Request *)&method);
        }
        else {
          Maybe<kj::HttpHeaders::Request>::Maybe(__return_storage_ptr__,(void *)0x0);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<HttpHeaders::Request> HttpHeaders::tryParseRequest(kj::ArrayPtr<char> content) {
  char* end = trimHeaderEnding(content);
  if (end == nullptr) return nullptr;

  char* ptr = content.begin();

  HttpHeaders::Request request;

  KJ_IF_MAYBE(method, consumeHttpMethod(ptr)) {
    request.method = *method;
    if (*ptr != ' ' && *ptr != '\t') {
      return nullptr;
    }
    ++ptr;
  } else {
    return nullptr;
  }

  KJ_IF_MAYBE(path, consumeWord(ptr)) {
    request.url = *path;
  } else {
    return nullptr;
  }

  // Ignore rest of line. Don't care about "HTTP/1.1" or whatever.
  consumeLine(ptr);

  if (!parseHeaders(ptr, end)) return nullptr;

  return request;
}